

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void expand_suite::expand_back_front_1(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  basic_iterator<int> first_end_07;
  basic_iterator<int> first_end_08;
  basic_iterator<int> first_end_09;
  basic_iterator<int> first_end_10;
  reference piVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  basic_iterator<int> first_begin_07;
  basic_iterator<int> first_begin_08;
  basic_iterator<int> first_begin_09;
  basic_iterator<int> first_begin_10;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_131;
  vector<int,_std::allocator<int>_> local_130;
  circular_view<int,_18446744073709551615UL> local_118;
  int local_f8 [4];
  circular_view<int,_18446744073709551615UL> *local_e8;
  size_type sStack_e0;
  circular_view<int,_18446744073709551615UL> *local_d8;
  size_type sStack_d0;
  circular_view<int,_18446744073709551615UL> *local_c8;
  size_type sStack_c0;
  circular_view<int,_18446744073709551615UL> *local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  type local_28 [6];
  
  local_118.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_118.member.cap = 4;
  local_118.member.size = 0;
  local_118.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0xb;
  local_f8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_30 = local_118.member.next % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = &local_118;
  first_begin.current = uVar3;
  first_begin.parent = &local_118;
  local_38 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb0a,"void expand_suite::expand_back_front_1()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  __l_00._M_len = 2;
  __l_00._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_00,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_40 = local_118.member.next % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = &local_118;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_118;
  local_48 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb12,"void expand_suite::expand_back_front_1()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0x16;
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  local_f8[2] = 0x16;
  __l_01._M_len = 3;
  __l_01._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_01,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_50 = local_118.member.next % uVar1;
  }
  first_end_01.current = sStack_50;
  first_end_01.parent = &local_118;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_118;
  local_58 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb1a,"void expand_suite::expand_back_front_1()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0xb;
  local_f8[3] = 0x16;
  __l_02._M_len = 4;
  __l_02._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_02,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_60 = local_118.member.next % uVar1;
  }
  first_end_02.current = sStack_60;
  first_end_02.parent = &local_118;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_118;
  local_68 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb22,"void expand_suite::expand_back_front_1()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0x21;
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  local_f8[2] = 0x16;
  local_f8[3] = 0x21;
  __l_03._M_len = 4;
  __l_03._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_03,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_70 = local_118.member.next % uVar1;
  }
  first_end_03.current = sStack_70;
  first_end_03.parent = &local_118;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_118;
  local_78 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb2a,"void expand_suite::expand_back_front_1()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0x21;
  local_f8[1] = 0;
  local_f8[2] = 0xb;
  local_f8[3] = 0x16;
  __l_04._M_len = 4;
  __l_04._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_04,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_80 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_80 = local_118.member.next % uVar1;
  }
  first_end_04.current = sStack_80;
  first_end_04.parent = &local_118;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_118;
  local_88 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb32,"void expand_suite::expand_back_front_1()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0x2c;
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  local_f8[2] = 0x16;
  local_f8[3] = 0x2c;
  __l_05._M_len = 4;
  __l_05._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_05,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_90 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_90 = local_118.member.next % uVar1;
  }
  first_end_05.current = sStack_90;
  first_end_05.parent = &local_118;
  first_begin_05.current = uVar3;
  first_begin_05.parent = &local_118;
  local_98 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb3a,"void expand_suite::expand_back_front_1()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0x2c;
  local_f8[1] = 0;
  local_f8[2] = 0xb;
  local_f8[3] = 0x16;
  __l_06._M_len = 4;
  __l_06._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_06,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_a0 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_a0 = local_118.member.next % uVar1;
  }
  first_end_06.current = sStack_a0;
  first_end_06.parent = &local_118;
  first_begin_06.current = uVar3;
  first_begin_06.parent = &local_118;
  local_a8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb42,"void expand_suite::expand_back_front_1()",first_begin_06,first_end_06,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0x37;
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  local_f8[2] = 0x16;
  local_f8[3] = 0x37;
  __l_07._M_len = 4;
  __l_07._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_07,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_b0 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_b0 = local_118.member.next % uVar1;
  }
  first_end_07.current = sStack_b0;
  first_end_07.parent = &local_118;
  first_begin_07.current = uVar3;
  first_begin_07.parent = &local_118;
  local_b8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb4a,"void expand_suite::expand_back_front_1()",first_begin_07,first_end_07,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0x37;
  local_f8[1] = 0;
  local_f8[2] = 0xb;
  local_f8[3] = 0x16;
  __l_08._M_len = 4;
  __l_08._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_08,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_c0 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_c0 = local_118.member.next % uVar1;
  }
  first_end_08.current = sStack_c0;
  first_end_08.parent = &local_118;
  first_begin_08.current = uVar3;
  first_begin_08.parent = &local_118;
  local_c8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb52,"void expand_suite::expand_back_front_1()",first_begin_08,first_end_08,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_118,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_118);
  *piVar2 = 0x42;
  local_f8[0] = 0;
  local_f8[1] = 0xb;
  local_f8[2] = 0x16;
  local_f8[3] = 0x42;
  __l_09._M_len = 4;
  __l_09._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_09,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_d0 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_d0 = local_118.member.next % uVar1;
  }
  first_end_09.current = sStack_d0;
  first_end_09.parent = &local_118;
  first_begin_09.current = uVar3;
  first_begin_09.parent = &local_118;
  local_d8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb5a,"void expand_suite::expand_back_front_1()",first_begin_09,first_end_09,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_118,1);
  local_f8[0] = 0x42;
  local_f8[1] = 0;
  local_f8[2] = 0xb;
  local_f8[3] = 0x16;
  __l_10._M_len = 4;
  __l_10._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,__l_10,&local_131);
  uVar1 = local_118.member.cap * 2;
  if ((uVar1 & local_118.member.cap * 2 - 1) == 0) {
    uVar3 = local_118.member.next - local_118.member.size & uVar1 - 1;
    sStack_e0 = uVar1 - 1 & local_118.member.next;
  }
  else {
    uVar3 = (local_118.member.next - local_118.member.size) % uVar1;
    sStack_e0 = local_118.member.next % uVar1;
  }
  first_end_10.current = sStack_e0;
  first_end_10.parent = &local_118;
  first_begin_10.current = uVar3;
  first_begin_10.parent = &local_118;
  local_e8 = &local_118;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xb62,"void expand_suite::expand_back_front_1()",first_begin_10,first_end_10,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_back_front_1()
{
    int array[4] = {};
    circular_view<int> span(array);
    // 11 XX XX XX
    // <>
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 XX XX XX
    // ->       <-
    span.expand_front(1);
    {
        std::vector<int> expect = { 0, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 XX XX
    // ---->    <-
    span.push_back(22);
    {
        std::vector<int> expect = { 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 XX XX
    // ----> <----
    span.expand_front(1);
    {
        std::vector<int> expect = { 0, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 33 XX
    // -------> <-
    span.push_back(33);
    {
        std::vector<int> expect = { 0, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 33 XX
    // ----> <----
    span.expand_front(1);
    {
        std::vector<int> expect = { 33, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 44 XX
    // -------> <-
    span.push_back(44);
    {
        std::vector<int> expect = { 0, 11, 22, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 44 XX
    // ----> <----
    span.expand_front(1);
    {
        std::vector<int> expect = { 44, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 55 XX
    // -------> <-
    span.push_back(55);
    {
        std::vector<int> expect = { 0, 11, 22, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 55 XX
    // ----> <----
    span.expand_front(1);
    {
        std::vector<int> expect = { 55, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 66 XX
    // -------> <-
    span.push_back(66);
    {
        std::vector<int> expect = { 0, 11, 22, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    // 11 22 66 XX
    // ----> <----
    span.expand_front(1);
    {
        std::vector<int> expect = { 66, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}